

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bsetstr(bstring b0,int pos,bstring b1,uchar fill)

{
  int iVar1;
  long lVar2;
  bstring local_48;
  bstring aux;
  ptrdiff_t pd;
  int newlen;
  int d;
  int i;
  uchar fill_local;
  bstring b1_local;
  int pos_local;
  bstring b0_local;
  
  if ((((pos < 0) || (b0 == (bstring)0x0)) || (b0->slen < 0)) ||
     (((b0->data == (uchar *)0x0 || (b0->mlen < b0->slen)) || (b0->mlen < 1)))) {
    b0_local._4_4_ = -1;
  }
  else if ((b1 == (bstring)0x0) || ((-1 < b1->slen && (b1->data != (uchar *)0x0)))) {
    local_48 = b1;
    pd._4_4_ = pos;
    if (b1 != (bstring)0x0) {
      lVar2 = (long)b1->data - (long)b0->data;
      if (((-1 < lVar2) && (lVar2 < b0->mlen)) && (local_48 = bstrcpy(b1), local_48 == (bstring)0x0)
         ) {
        return -1;
      }
      pd._4_4_ = local_48->slen + pos;
    }
    iVar1 = balloc(b0,pd._4_4_ + 1);
    if (iVar1 == 0) {
      pd._0_4_ = b0->slen;
      if ((int)pd < pos) {
        for (newlen = b0->slen; pd._0_4_ = pos, newlen < pos; newlen = newlen + 1) {
          b0->data[newlen] = fill;
        }
      }
      if (local_48 != (bstring)0x0) {
        if (0 < local_48->slen) {
          memmove(b0->data + pos,local_48->data,(long)local_48->slen);
        }
        if (local_48 != b1) {
          bdestroy(local_48);
        }
      }
      if ((int)pd < pd._4_4_) {
        pd._0_4_ = pd._4_4_;
      }
      b0->slen = (int)pd;
      b0->data[(int)pd] = '\0';
      b0_local._4_4_ = 0;
    }
    else {
      if (local_48 != b1) {
        bdestroy(local_48);
      }
      b0_local._4_4_ = -1;
    }
  }
  else {
    b0_local._4_4_ = -1;
  }
  return b0_local._4_4_;
}

Assistant:

int bsetstr (bstring b0, int pos, const bstring b1, unsigned char fill) {
int i, d, newlen;
ptrdiff_t pd;
bstring aux = b1;

	if (pos < 0 || b0 == NULL || b0->slen < 0 || NULL == b0->data || 
	    b0->mlen < b0->slen || b0->mlen <= 0) return BSTR_ERR;
	if (b1 != NULL && (b1->slen < 0 || b1->data == NULL)) return BSTR_ERR;

	d = pos;

	/* Aliasing case */
	if (NULL != aux) {
		if ((pd = (ptrdiff_t) (b1->data - b0->data)) >= 0 && pd < (ptrdiff_t) b0->mlen) {
			if (NULL == (aux = bstrcpy (b1))) return BSTR_ERR;
		}
		d += aux->slen;
	}

	/* Increase memory size if necessary */
	if (balloc (b0, d + 1) != BSTR_OK) {
		if (aux != b1) bdestroy (aux);
		return BSTR_ERR;
	}

	newlen = b0->slen;

	/* Fill in "fill" character as necessary */
	if (pos > newlen) {
		for (i = b0->slen; i < pos; i ++) b0->data[i] = fill;
		newlen = pos;
	}

	/* Copy b1 to position pos in b0. */
	if (aux != NULL) {
		bBlockCopy ((char *) (b0->data + pos), (char *) aux->data, aux->slen);
		if (aux != b1) bdestroy (aux);
	}

	/* Indicate the potentially increased size of b0 */
	if (d > newlen) newlen = d;

	b0->slen = newlen;
	b0->data[newlen] = (unsigned char) '\0';

	return BSTR_OK;
}